

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  uint uVar1;
  stbi__context *psVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  stbi__uint32 sVar8;
  stbi_uc *psVar9;
  long lVar10;
  byte *pbVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  uint uVar17;
  byte bVar19;
  uint uVar20;
  long lVar21;
  int iVar22;
  byte *pbVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  stbi_uc *__dest;
  bool bVar28;
  uint local_d8;
  uint local_70;
  stbi_uc *local_58;
  stbi_uc *local_38;
  ulong uVar18;
  
  psVar2 = a->s;
  uVar1 = psVar2->img_n;
  if (uVar1 + 1 != out_n && uVar1 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                  ,0xf7d,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  uVar17 = x * out_n;
  uVar18 = (ulong)uVar17;
  psVar9 = (stbi_uc *)malloc((ulong)(uVar17 * y));
  a->out = psVar9;
  if (psVar9 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar5 = uVar1 * x;
  uVar6 = uVar5 * depth + 7 >> 3;
  uVar7 = (uVar6 + 1) * y;
  if ((psVar2->img_x == x) && (psVar2->img_y == y)) {
    if (uVar7 == raw_len) {
LAB_0011a005:
      lVar21 = -uVar18;
      lVar24 = (long)out_n;
      uVar26 = 0;
      if (0 < (int)uVar1) {
        uVar26 = (ulong)uVar1;
      }
      lVar12 = -lVar24;
      uVar7 = 0;
      uVar16 = 0;
      do {
        if (uVar16 == y) {
          if (7 < depth) {
            return 1;
          }
          uVar7 = 0;
          uVar26 = 0;
          do {
            if (uVar26 == y) {
              return 1;
            }
            bVar4 = 1;
            if (color == 0) {
              bVar4 = ""[(uint)depth];
            }
            uVar16 = (ulong)uVar7;
            psVar9 = a->out;
            uVar14 = (ulong)(uVar17 * (int)uVar26);
            if (depth == 4) {
              lVar21 = (uVar18 - uVar6) + uVar16;
              lVar24 = 0;
              for (uVar20 = uVar5; 1 < (int)uVar20; uVar20 = uVar20 - 2) {
                psVar9[lVar24 * 2 + uVar16] = (psVar9[lVar24 + lVar21] >> 4) * bVar4;
                psVar9[lVar24 * 2 + uVar16 + 1] = (psVar9[lVar24 + lVar21] & 0xf) * bVar4;
                lVar24 = lVar24 + 1;
              }
              if (uVar20 == 1) {
                psVar9[lVar24 * 2 + uVar16] = (psVar9[lVar24 + lVar21] >> 4) * bVar4;
              }
            }
            else {
              pbVar23 = psVar9 + ((uVar18 + uVar14) - (ulong)uVar6);
              if (depth == 2) {
                psVar9 = psVar9 + uVar16 + 3;
                for (uVar20 = uVar5; 3 < (int)uVar20; uVar20 = uVar20 - 4) {
                  psVar9[-3] = (*pbVar23 >> 6) * bVar4;
                  psVar9[-2] = (*pbVar23 >> 4 & 3) * bVar4;
                  psVar9[-1] = (*pbVar23 >> 2 & 3) * bVar4;
                  *psVar9 = (*pbVar23 & 3) * bVar4;
                  pbVar23 = pbVar23 + 1;
                  psVar9 = psVar9 + 4;
                }
                if (((0 < (int)uVar20) && (psVar9[-3] = (*pbVar23 >> 6) * bVar4, uVar20 != 1)) &&
                   (psVar9[-2] = (*pbVar23 >> 4 & 3) * bVar4, uVar20 == 3)) {
                  psVar9[-1] = (*pbVar23 >> 2 & 3) * bVar4;
                }
              }
              else if (depth == 1) {
                pbVar11 = psVar9 + uVar16 + 7;
                for (uVar20 = uVar5; 7 < (int)uVar20; uVar20 = uVar20 - 8) {
                  pbVar11[-7] = (char)*pbVar23 >> 7 & bVar4;
                  pbVar11[-6] = (char)(*pbVar23 * '\x02') >> 7 & bVar4;
                  pbVar11[-5] = (char)(*pbVar23 << 2) >> 7 & bVar4;
                  pbVar11[-4] = (char)(*pbVar23 << 3) >> 7 & bVar4;
                  pbVar11[-3] = (char)(*pbVar23 << 4) >> 7 & bVar4;
                  pbVar11[-2] = (char)(*pbVar23 << 5) >> 7 & bVar4;
                  pbVar11[-1] = (char)(*pbVar23 << 6) >> 7 & bVar4;
                  bVar19 = bVar4;
                  if ((*pbVar23 & 1) == 0) {
                    bVar19 = 0;
                  }
                  *pbVar11 = bVar19;
                  pbVar23 = pbVar23 + 1;
                  pbVar11 = pbVar11 + 8;
                }
                if (((((0 < (int)uVar20) && (pbVar11[-7] = (char)*pbVar23 >> 7 & bVar4, uVar20 != 1)
                      ) && ((pbVar11[-6] = (char)(*pbVar23 * '\x02') >> 7 & bVar4, 2 < uVar20 &&
                            ((pbVar11[-5] = (char)(*pbVar23 << 2) >> 7 & bVar4, uVar20 != 3 &&
                             (pbVar11[-4] = (char)(*pbVar23 << 3) >> 7 & bVar4, 4 < uVar20)))))) &&
                    (pbVar11[-3] = (char)(*pbVar23 << 4) >> 7 & bVar4, uVar20 != 5)) &&
                   (pbVar11[-2] = (char)(*pbVar23 << 5) >> 7 & bVar4, uVar20 == 7)) {
                  pbVar11[-1] = (char)(*pbVar23 << 6) >> 7 & bVar4;
                }
              }
            }
            if (uVar1 != out_n) {
              psVar9 = a->out;
              if (uVar1 == 1) {
                uVar20 = x * 2 - 1;
                for (iVar22 = 0; -1 < (int)((x - 1) + iVar22); iVar22 = iVar22 + -1) {
                  psVar9[uVar20 + uVar14] = 0xff;
                  psVar9[(uVar20 - 1) + uVar14] = psVar9[((x - 1) + iVar22 & 0x7fffffff) + uVar14];
                  uVar20 = uVar20 - 2;
                }
              }
              else {
                iVar22 = x - 1;
                uVar3 = x * 4;
                uVar20 = x * 3;
                if (uVar1 != 3) {
                  __assert_fail("img_n == 3",
                                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                                ,0x1018,
                                "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                               );
                }
                while( true ) {
                  uVar20 = uVar20 - 3;
                  if (iVar22 < 0) break;
                  psVar9[(uVar3 - 1) + uVar14] = 0xff;
                  psVar9[(uVar3 - 2) + uVar14] = psVar9[(ulong)uVar20 + uVar14 + 2];
                  psVar9[(uVar3 - 3) + uVar14] = psVar9[(ulong)uVar20 + uVar14 + 1];
                  psVar9[(uVar3 - 4) + uVar14] = psVar9[uVar20 + uVar14];
                  iVar22 = iVar22 + -1;
                  uVar3 = uVar3 - 4;
                }
              }
            }
            uVar26 = uVar26 + 1;
            uVar7 = uVar7 + uVar17;
          } while( true );
        }
        uVar14 = (ulong)*raw;
        if (4 < uVar14) {
          stbi__g_failure_reason = "invalid filter";
          return 0;
        }
        local_58 = a->out;
        psVar9 = local_58 + uVar17 * (int)uVar16;
        local_70 = uVar1;
        local_38 = psVar9;
        local_d8 = x;
        if (depth < 8) {
          if (x < uVar6) {
            __assert_fail("img_width_bytes <= x",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                          ,0xf93,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          local_38 = psVar9 + (uVar17 - uVar6);
          local_70 = 1;
          local_d8 = uVar6;
        }
        if (uVar16 == 0) {
          uVar14 = (ulong)""[uVar14];
        }
        uVar13 = (ulong)uVar7;
        uVar25 = 0;
        if (0 < (int)local_70) {
          uVar25 = (ulong)local_70;
        }
        lVar10 = uVar13 + lVar21;
        for (uVar27 = 0; uVar25 != uVar27; uVar27 = uVar27 + 1) {
          switch(uVar14) {
          case 0:
          case 1:
          case 5:
          case 6:
            bVar4 = raw[uVar27 + 1];
            break;
          case 2:
            bVar4 = local_58[uVar27 + lVar10];
            goto LAB_0011a1f0;
          case 3:
            bVar4 = local_58[uVar27 + lVar10] >> 1;
LAB_0011a1f0:
            bVar4 = bVar4 + raw[uVar27 + 1];
            break;
          case 4:
            bVar4 = raw[uVar27 + 1];
            iVar22 = stbi__paeth(0,(uint)local_58[uVar27 + lVar10],0);
            bVar4 = (char)iVar22 + bVar4;
            break;
          default:
            goto switchD_0011a190_default;
          }
          local_38[uVar27] = bVar4;
switchD_0011a190_default:
        }
        if (depth == 8) {
          if (uVar1 != out_n) {
            local_38[(int)uVar1] = 0xff;
          }
          raw = raw + (long)(int)uVar1 + 1;
          lVar10 = lVar24;
        }
        else {
          raw = raw + 2;
          lVar10 = 1;
        }
        __dest = local_38 + lVar10;
        if (depth < 8 || uVar1 == out_n) {
          uVar20 = (local_d8 - 1) * uVar1;
          if ((byte)uVar14 < 7) {
            lVar15 = (long)(int)local_70;
            switch(uVar14) {
            case 0:
              memcpy(__dest,raw,(long)(int)uVar20);
              break;
            case 1:
              uVar3 = uVar20;
              if ((int)uVar20 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                __dest[uVar14] = __dest[uVar14 - lVar15] + raw[uVar14];
              }
              break;
            case 2:
              uVar3 = uVar20;
              if ((int)uVar20 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                __dest[uVar14] = local_58[uVar14 + lVar10 + uVar13 + lVar21] + raw[uVar14];
              }
              break;
            case 3:
              uVar3 = uVar20;
              if ((int)uVar20 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                __dest[uVar14] =
                     (char)((uint)__dest[uVar14 - lVar15] +
                            (uint)local_58[uVar14 + lVar10 + uVar13 + lVar21] >> 1) + raw[uVar14];
              }
              break;
            case 4:
              uVar3 = uVar20;
              if ((int)uVar20 < 1) {
                uVar3 = 0;
              }
              uVar14 = (ulong)uVar3;
              pbVar11 = local_58 + lVar10 + uVar13 + lVar21;
              pbVar23 = raw;
              while (bVar28 = uVar14 != 0, uVar14 = uVar14 - 1, bVar28) {
                bVar4 = *pbVar23;
                iVar22 = stbi__paeth((uint)__dest[-lVar15],(uint)*pbVar11,(uint)pbVar11[-lVar15]);
                *__dest = (char)iVar22 + bVar4;
                __dest = __dest + 1;
                pbVar11 = pbVar11 + 1;
                pbVar23 = pbVar23 + 1;
              }
              break;
            case 5:
              uVar3 = uVar20;
              if ((int)uVar20 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                __dest[uVar14] = (__dest[uVar14 - lVar15] >> 1) + raw[uVar14];
              }
              break;
            case 6:
              uVar3 = uVar20;
              if ((int)uVar20 < 1) {
                uVar3 = 0;
              }
              for (uVar14 = 0; uVar3 != uVar14; uVar14 = uVar14 + 1) {
                __dest[uVar14] = __dest[uVar14 - lVar15] + raw[uVar14];
              }
            }
          }
          raw = raw + (int)uVar20;
        }
        else {
          if (uVar1 + 1 != out_n) {
            __assert_fail("img_n+1 == out_n",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_image.h"
                          ,0xfc8,
                          "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                         );
          }
          if ((byte)uVar14 < 7) {
            psVar9 = psVar9 + lVar10 + lVar21;
            switch(uVar14) {
            case 0:
              sVar8 = x;
              while (sVar8 = sVar8 - 1, sVar8 != 0) {
                for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = raw[uVar14];
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar24;
              }
              break;
            case 1:
              sVar8 = x;
              while (sVar8 = sVar8 - 1, sVar8 != 0) {
                for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = __dest[uVar14 + lVar12] + raw[uVar14];
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar24;
              }
              break;
            case 2:
              sVar8 = x;
              while (sVar8 = sVar8 - 1, sVar8 != 0) {
                for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = psVar9[uVar14] + raw[uVar14];
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar24;
                psVar9 = psVar9 + lVar24;
              }
              break;
            case 3:
              sVar8 = x;
              while (sVar8 = sVar8 - 1, sVar8 != 0) {
                for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] =
                       (char)((uint)__dest[uVar14 + lVar12] + (uint)psVar9[uVar14] >> 1) +
                       raw[uVar14];
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar24;
                psVar9 = psVar9 + lVar24;
              }
              break;
            case 4:
              local_38 = local_38 + lVar10 + lVar12;
              local_58 = local_58 + uVar13 + lVar10 + (lVar12 - uVar18);
              sVar8 = x;
              while (sVar8 = sVar8 - 1, sVar8 != 0) {
                for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                  bVar4 = raw[uVar14];
                  iVar22 = stbi__paeth((uint)local_38[uVar14],(uint)psVar9[uVar14],
                                       (uint)local_58[uVar14]);
                  __dest[uVar14] = (char)iVar22 + bVar4;
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar24;
                psVar9 = psVar9 + lVar24;
                local_38 = local_38 + lVar24;
                local_58 = local_58 + lVar24;
              }
              break;
            case 5:
              sVar8 = x;
              while (sVar8 = sVar8 - 1, sVar8 != 0) {
                for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = (__dest[uVar14 + lVar12] >> 1) + raw[uVar14];
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar24;
              }
              break;
            case 6:
              sVar8 = x;
              while (sVar8 = sVar8 - 1, sVar8 != 0) {
                for (uVar14 = 0; uVar26 != uVar14; uVar14 = uVar14 + 1) {
                  __dest[uVar14] = __dest[uVar14 + lVar12] + raw[uVar14];
                }
                __dest[(int)uVar1] = 0xff;
                raw = raw + (int)uVar1;
                __dest = __dest + lVar24;
              }
            }
          }
        }
        uVar16 = uVar16 + 1;
        uVar7 = uVar17 + uVar7;
      } while( true );
    }
  }
  else if (uVar7 <= raw_len) goto LAB_0011a005;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc(x * y * out_n); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior = cur - stride;
      int filter = *raw++;
      int filter_bytes = img_n;
      int width = x;
      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*img_n;
         #define CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); break;
         }
         #undef CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[img_n]=255,raw+=img_n,cur+=out_n,prior+=out_n) \
                   for (k=0; k < img_n; ++k)
         switch (filter) {
            CASE(STBI__F_none)         cur[k] = raw[k]; break;
            CASE(STBI__F_sub)          cur[k] = STBI__BYTECAST(raw[k] + cur[k-out_n]); break;
            CASE(STBI__F_up)           cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            CASE(STBI__F_avg)          cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-out_n])>>1)); break;
            CASE(STBI__F_paeth)        cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],prior[k],prior[k-out_n])); break;
            CASE(STBI__F_avg_first)    cur[k] = STBI__BYTECAST(raw[k] + (cur[k-out_n] >> 1)); break;
            CASE(STBI__F_paeth_first)  cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-out_n],0,0)); break;
         }
         #undef CASE
      }
   }

   // we make a separate pass to expand bits to pixels; for performance,
   // this could run two scanlines behind the above code, so it won't
   // intefere with filtering but will still be in the cache.
   if (depth < 8) {
      for (j=0; j < y; ++j) {
         stbi_uc *cur = a->out + stride*j;
         stbi_uc *in  = a->out + stride*j + x*out_n - img_width_bytes;
         // unpack 1/2/4-bit into a 8-bit buffer. allows us to keep the common 8-bit path optimal at minimal cost for 1/2/4-bit
         // png guarante byte alignment, if width is not multiple of 8/4/2 we'll decode dummy trailing data that will be skipped in the later loop
         stbi_uc scale = (color == 0) ? stbi__depth_scale_table[depth] : 1; // scale grayscale values to 0..255 range

         // note that the final byte might overshoot and write more data than desired.
         // we can allocate enough data that this never writes out of memory, but it
         // could also overwrite the next scanline. can it overwrite non-empty data
         // on the next scanline? yes, consider 1-pixel-wide scanlines with 1-bit-per-pixel.
         // so we need to explicitly clamp the final ones

         if (depth == 4) {
            for (k=x*img_n; k >= 2; k-=2, ++in) {
               *cur++ = scale * ((*in >> 4)       );
               *cur++ = scale * ((*in     ) & 0x0f);
            }
            if (k > 0) *cur++ = scale * ((*in >> 4)       );
         } else if (depth == 2) {
            for (k=x*img_n; k >= 4; k-=4, ++in) {
               *cur++ = scale * ((*in >> 6)       );
               *cur++ = scale * ((*in >> 4) & 0x03);
               *cur++ = scale * ((*in >> 2) & 0x03);
               *cur++ = scale * ((*in     ) & 0x03);
            }
            if (k > 0) *cur++ = scale * ((*in >> 6)       );
            if (k > 1) *cur++ = scale * ((*in >> 4) & 0x03);
            if (k > 2) *cur++ = scale * ((*in >> 2) & 0x03);
         } else if (depth == 1) {
            for (k=x*img_n; k >= 8; k-=8, ++in) {
               *cur++ = scale * ((*in >> 7)       );
               *cur++ = scale * ((*in >> 6) & 0x01);
               *cur++ = scale * ((*in >> 5) & 0x01);
               *cur++ = scale * ((*in >> 4) & 0x01);
               *cur++ = scale * ((*in >> 3) & 0x01);
               *cur++ = scale * ((*in >> 2) & 0x01);
               *cur++ = scale * ((*in >> 1) & 0x01);
               *cur++ = scale * ((*in     ) & 0x01);
            }
            if (k > 0) *cur++ = scale * ((*in >> 7)       );
            if (k > 1) *cur++ = scale * ((*in >> 6) & 0x01);
            if (k > 2) *cur++ = scale * ((*in >> 5) & 0x01);
            if (k > 3) *cur++ = scale * ((*in >> 4) & 0x01);
            if (k > 4) *cur++ = scale * ((*in >> 3) & 0x01);
            if (k > 5) *cur++ = scale * ((*in >> 2) & 0x01);
            if (k > 6) *cur++ = scale * ((*in >> 1) & 0x01);
         }
         if (img_n != out_n) {
            // insert alpha = 255
            stbi_uc *cur = a->out + stride*j;
            int i;
            if (img_n == 1) {
               for (i=x-1; i >= 0; --i) {
                  cur[i*2+1] = 255;
                  cur[i*2+0] = cur[i];
               }
            } else {
               STBI_ASSERT(img_n == 3);
               for (i=x-1; i >= 0; --i) {
                  cur[i*4+3] = 255;
                  cur[i*4+2] = cur[i*3+2];
                  cur[i*4+1] = cur[i*3+1];
                  cur[i*4+0] = cur[i*3+0];
               }
            }
         }
      }
   }

   return 1;
}